

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_scientific.h
# Opt level: O0

ScientificMatcher * __thiscall
icu_63::numparse::impl::ScientificMatcher::operator=
          (ScientificMatcher *this,ScientificMatcher *param_1)

{
  ScientificMatcher *param_1_local;
  ScientificMatcher *this_local;
  
  NumberParseMatcher::operator=(&this->super_NumberParseMatcher,&param_1->super_NumberParseMatcher);
  UnicodeString::operator=(&this->fExponentSeparatorString,&param_1->fExponentSeparatorString);
  DecimalMatcher::operator=(&this->fExponentMatcher,&param_1->fExponentMatcher);
  UnicodeString::operator=(&this->fCustomMinusSign,&param_1->fCustomMinusSign);
  UnicodeString::operator=(&this->fCustomPlusSign,&param_1->fCustomPlusSign);
  return this;
}

Assistant:

ScientificMatcher() = default;